

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_71ad4a::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  ulong val;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  pointer pbVar5;
  ulong uVar6;
  string *name;
  long lVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string_view value_01;
  int item;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  int local_1bc;
  char *local_1b8;
  string *local_1b0;
  char *local_1a8;
  size_t local_1a0;
  char local_198;
  undefined7 uStack_197;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  size_t local_178;
  char *pcStack_170;
  undefined8 local_168;
  char *local_160;
  pointer local_158;
  char *pcStack_150;
  undefined8 local_148;
  char *local_140;
  size_t local_138;
  char *pcStack_130;
  undefined8 local_128;
  char *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  string *local_f8;
  unsigned_long local_f0;
  ulong local_e8;
  string local_e0;
  undefined1 local_c0 [48];
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar5) < 0x80) {
    local_188._M_len = (size_t)&local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"sub-command GET requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((size_t *)local_188._M_len != &local_178) {
      operator_delete((void *)local_188._M_len,local_178 + 1);
    }
    bVar2 = false;
  }
  else {
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = GetList(&local_118,pbVar5 + 1,status->Makefile);
    name = pbVar1 + -1;
    if (bVar2) {
      if (local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_188._M_len = (size_t)&local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"GET given empty list","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((size_t *)local_188._M_len != &local_178) {
          operator_delete((void *)local_188._M_len,local_178 + 1);
        }
        bVar2 = false;
      }
      else {
        local_1a8 = &local_198;
        local_1a0 = 0;
        local_198 = '\0';
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) - 1U < 3;
        local_f8 = name;
        if (!bVar2) {
          local_e8 = (long)local_118.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
          local_1b0 = (string *)&status->Error;
          local_f0 = local_e8 - 1;
          uVar6 = 2;
          local_1b8 = "";
          lVar7 = 0x40;
          do {
            bVar3 = GetIndexArg((string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar7),&local_1bc,
                                status->Makefile);
            if (bVar3) {
              std::__cxx11::string::append((char *)&local_1a8);
              val = local_e8;
              if (local_1bc < 0) {
                local_1bc = local_1bc + (int)local_e8;
              }
              uVar4 = (ulong)local_1bc;
              if (((long)uVar4 < 0) || (local_e8 <= uVar4)) {
                cmAlphaNum::cmAlphaNum(&local_90,local_1bc);
                local_188._M_len = 7;
                local_188._M_str = "index: ";
                local_178 = local_90.View_._M_len;
                pcStack_170 = local_90.View_._M_str;
                local_168 = 0x10;
                local_160 = " out of range (-";
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c0,val);
                local_158 = (pointer)local_c0._0_8_;
                pcStack_150 = (char *)local_c0._8_8_;
                local_148 = 2;
                local_140 = ", ";
                cmAlphaNum::cmAlphaNum(&local_60,local_f0);
                local_138 = local_60.View_._M_len;
                pcStack_130 = local_60.View_._M_str;
                local_128 = 1;
                local_120 = ")";
                views_00._M_len = 7;
                views_00._M_array = &local_188;
                cmCatViews_abi_cxx11_(&local_e0,views_00);
                std::__cxx11::string::_M_assign(local_1b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                bVar3 = false;
                local_1b8 = ";";
              }
              else {
                bVar3 = true;
                std::__cxx11::string::_M_append
                          ((char *)&local_1a8,
                           (ulong)local_118.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p)
                ;
                local_1b8 = ";";
              }
            }
            else {
              pbVar5 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcStack_170 = *(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar7);
              local_178 = *(size_t *)((long)&pbVar5->_M_string_length + lVar7);
              local_188._M_len = 7;
              local_188._M_str = "index: ";
              local_168 = 0x15;
              local_160 = " is not a valid index";
              views._M_len = 3;
              views._M_array = &local_188;
              cmCatViews_abi_cxx11_((string *)local_c0,views);
              std::__cxx11::string::_M_assign(local_1b0);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
              bVar3 = false;
            }
            if (!bVar3) goto LAB_0021a6de;
            uVar6 = uVar6 + 1;
            pbVar5 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar7 = lVar7 + 0x20;
            bVar3 = uVar6 < ((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
                            - 1U;
            bVar2 = !bVar3;
          } while (bVar3);
        }
        value_00._M_str = local_1a8;
        value_00._M_len = local_1a0;
        cmMakefile::AddDefinition(status->Makefile,local_f8,value_00);
LAB_0021a6de:
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
        }
      }
    }
    else {
      bVar2 = true;
      value_01._M_str = "NOTFOUND";
      value_01._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_01);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
  }
  return bVar2;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (varArgsExpanded.empty()) {
    status.SetError("GET given empty list");
    return false;
  }

  std::string value;
  size_t cc;
  const char* sep = "";
  size_t nitem = varArgsExpanded.size();
  for (cc = 2; cc < args.size() - 1; cc++) {
    int item;
    if (!GetIndexArg(args[cc], &item, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    value += sep;
    sep = ";";
    if (item < 0) {
      item = static_cast<int>(nitem) + item;
    }
    if (item < 0 || nitem <= static_cast<size_t>(item)) {
      status.SetError(cmStrCat("index: ", item, " out of range (-", nitem,
                               ", ", nitem - 1, ")"));
      return false;
    }
    value += varArgsExpanded[item];
  }

  status.GetMakefile().AddDefinition(variableName, value);
  return true;
}